

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__skin
          (LibraryControllersLoader15 *this,skin__AttributeData *attributeData)

{
  int iVar1;
  skin__AttributeData attrData;
  uint local_110 [2];
  URI local_108;
  
  COLLADABU::URI::URI(&local_108);
  local_110[0] = 0;
  if ((attributeData->present_attributes & 1) != 0) {
    COLLADABU::URI::operator=(&local_108,&attributeData->source);
    local_110[0] = local_110[0] | 1;
  }
  iVar1 = (*(this->mLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x1b])(this->mLoader,local_110);
  COLLADABU::URI::~URI(&local_108);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryControllersLoader15::begin__skin( const COLLADASaxFWL15::skin__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__skin(attributeData));
COLLADASaxFWL::skin__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT) == COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT ) {
    attrData.source = attributeData.source;
    attrData.present_attributes |= COLLADASaxFWL::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT;
}
return mLoader->begin__skin(attrData);
}